

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

Json __thiscall json11::anon_unknown_21::JsonParser::parse_json(JsonParser *this,int depth)

{
  byte *pbVar1;
  size_t sVar2;
  pointer pcVar3;
  double value;
  char cVar4;
  int value_00;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *this_00;
  size_t sVar5;
  char c;
  char c_00;
  char c_01;
  byte bVar6;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  undefined8 extraout_RDX_03;
  size_t sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  undefined4 in_register_00000034;
  JsonParser *this_01;
  char *pcVar10;
  string *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_03;
  string *this_04;
  size_t sVar11;
  bool c_02;
  Json JVar12;
  string key;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
  data;
  vector<json11::Json,_std::allocator<json11::Json>_> data_1;
  string local_80;
  Json local_60;
  Json local_50;
  Json local_40;
  
  this_01 = (JsonParser *)CONCAT44(in_register_00000034,depth);
  this_02 = &key;
  this_04 = &key;
  if (in_EDX < 0xc9) {
    cVar4 = get_next_token(this_01);
    if (this_01->failed == true) {
      Json::Json((Json *)this);
      _Var7._M_pi = extraout_RDX_00;
      goto LAB_00106eb7;
    }
    c_02 = 9 < (byte)(cVar4 - 0x30U);
    if (cVar4 == '-' || !c_02) {
      sVar2 = this_01->i;
      sVar9 = sVar2 - 1;
      this_01->i = sVar9;
      pcVar3 = (this_01->str->_M_dataplus)._M_p;
      cVar4 = pcVar3[sVar2 - 1];
      sVar11 = sVar9;
      if (cVar4 == '-') {
        this_01->i = sVar2;
        cVar4 = pcVar3[sVar2];
        sVar11 = sVar2;
      }
      if (cVar4 == '0') {
        sVar5 = sVar11 + 1;
        this_01->i = sVar5;
        bVar6 = pcVar3[sVar11 + 1];
        if ((byte)(bVar6 - 0x30) < 10) {
          pcVar10 = "leading 0s not permitted in numbers";
          goto LAB_00106e76;
        }
      }
      else {
        if (8 < (byte)(cVar4 - 0x31U)) {
          esc_abi_cxx11_((string *)&data_1,(json11 *)(ulong)(uint)(int)cVar4,cVar4 - 0x31U);
          std::operator+(&key,"invalid ",(string *)&data_1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                         &key," in number");
          fail(this,(string *)this_01);
          std::__cxx11::string::~string((string *)&data);
          std::__cxx11::string::~string((string *)&key);
          this_02 = (string *)&data_1;
          goto LAB_00106e97;
        }
        do {
          sVar5 = sVar11 + 1;
          this_01->i = sVar5;
          bVar6 = pcVar3[sVar11 + 1];
          sVar11 = sVar5;
        } while ((byte)(bVar6 - 0x30) < 10);
      }
      if (bVar6 == 0x2e) {
        this_01->i = sVar5 + 1;
        bVar6 = pcVar3[sVar5 + 1];
        if (9 < (byte)(bVar6 - 0x30)) {
          pcVar10 = "at least one digit required in fractional part";
          goto LAB_00106e76;
        }
        sVar5 = sVar5 + 2;
        while ((byte)(bVar6 - 0x30) < 10) {
          this_01->i = sVar5;
          pbVar1 = (byte *)(pcVar3 + sVar5);
          sVar5 = sVar5 + 1;
          bVar6 = *pbVar1;
        }
        sVar5 = sVar5 - 1;
      }
      else if (((bVar6 != 0x45) && (bVar6 != 0x65)) && (sVar5 - sVar9 < 10)) {
        value_00 = atoi(pcVar3 + (sVar2 - 1));
        Json::Json((Json *)this,value_00);
        _Var7._M_pi = extraout_RDX_01;
        goto LAB_00106eb7;
      }
      if ((bVar6 | 0x20) == 0x65) {
        sVar9 = sVar5 + 1;
        this_01->i = sVar9;
        cVar4 = pcVar3[sVar5 + 1];
        if ((cVar4 == '-') || (cVar4 == '+')) {
          sVar9 = sVar5 + 2;
          this_01->i = sVar9;
          cVar4 = pcVar3[sVar5 + 2];
        }
        if (9 < (byte)(cVar4 - 0x30U)) {
          pcVar10 = "at least one digit required in exponent";
          goto LAB_00106e76;
        }
        while (sVar9 = sVar9 + 1, (byte)(cVar4 - 0x30U) < 10) {
          this_01->i = sVar9;
          cVar4 = pcVar3[sVar9];
        }
      }
      value = strtod(pcVar3 + (sVar2 - 1),(char **)0x0);
      Json::Json((Json *)this,value);
      _Var7._M_pi = extraout_RDX_04;
      goto LAB_00106eb7;
    }
    if (cVar4 == '\"') {
      (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_
                ((string *)&data,(JsonParser *)this_01);
      Json::Json((Json *)this,(string *)&data);
    }
    else {
      if (cVar4 == '[') {
        data_1.super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data_1.super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data_1.super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cVar4 = get_next_token(this_01);
        if (cVar4 == ']') {
LAB_0010738d:
          Json::Json((Json *)this,&data_1);
        }
        else {
          while( true ) {
            this_01->i = this_01->i - 1;
            parse_json((JsonParser *)&data,depth);
            std::vector<json11::Json,_std::allocator<json11::Json>_>::emplace_back<json11::Json>
                      (&data_1,(Json *)&data);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &data._M_t._M_impl.super__Rb_tree_header);
            if (this_01->failed == true) break;
            cVar4 = get_next_token(this_01);
            if (cVar4 != ',') {
              if (cVar4 == ']') goto LAB_0010738d;
              esc_abi_cxx11_(&key,(json11 *)(ulong)(uint)(int)cVar4,c);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &data,"expected \',\' in list, got ",&key);
              fail(this,(string *)this_01);
              std::__cxx11::string::~string((string *)&data);
              std::__cxx11::string::~string((string *)&key);
              goto LAB_001073f5;
            }
            get_next_token(this_01);
          }
          Json::Json((Json *)this);
        }
LAB_001073f5:
        std::vector<json11::Json,_std::allocator<json11::Json>_>::~vector(&data_1);
        _Var7._M_pi = extraout_RDX_05;
        goto LAB_00106eb7;
      }
      if (cVar4 == 'f') {
        std::__cxx11::string::string((string *)&data,"false",(allocator *)&key);
        Json::Json(&local_60,false);
        expect(this,(string *)this_01,(Json *)&data);
        this_03 = &local_60.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else if (cVar4 == 'n') {
        std::__cxx11::string::string((string *)&data,"null",(allocator *)&key);
        Json::Json(&local_40);
        expect(this,(string *)this_01,(Json *)&data);
        this_03 = &local_40.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else {
        if (cVar4 == '{') {
          data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &data._M_t._M_impl.super__Rb_tree_header._M_header;
          data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          cVar4 = get_next_token(this_01);
          if (cVar4 == '}') {
LAB_001070f9:
            Json::Json((Json *)this,&data);
          }
          else {
            uVar8 = extraout_RDX_02;
            while (cVar4 == '\"') {
              (anonymous_namespace)::JsonParser::parse_string_abi_cxx11_(&key,(JsonParser *)this_01)
              ;
              if (this_01->failed == true) {
LAB_001073a6:
                Json::Json((Json *)this);
                goto LAB_001074cb;
              }
              cVar4 = get_next_token(this_01);
              if (cVar4 != ':') {
                esc_abi_cxx11_(&local_80,(json11 *)(ulong)(uint)(int)cVar4,c_00);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &data_1,"expected \':\' in object, got ",&local_80);
LAB_001074a3:
                fail(this,(string *)this_01);
                std::__cxx11::string::~string((string *)&data_1);
                std::__cxx11::string::~string((string *)&local_80);
                this_04 = &key;
                goto LAB_001074cb;
              }
              parse_json((JsonParser *)&data_1,depth);
              this_00 = (__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
                        ::operator[](&data,&key);
              std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (this_00,(__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)
                                 &data_1);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &data_1.super__Vector_base<json11::Json,_std::allocator<json11::Json>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
              if (this_01->failed == true) goto LAB_001073a6;
              cVar4 = get_next_token(this_01);
              if (cVar4 != ',') {
                if (cVar4 != '}') {
                  esc_abi_cxx11_(&local_80,(json11 *)(ulong)(uint)(int)cVar4,c_01);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&data_1,"expected \',\' in object, got ",&local_80);
                  goto LAB_001074a3;
                }
                std::__cxx11::string::~string((string *)&key);
                goto LAB_001070f9;
              }
              cVar4 = get_next_token(this_01);
              std::__cxx11::string::~string((string *)&key);
              uVar8 = extraout_RDX_03;
            }
            esc_abi_cxx11_((string *)&data_1,(json11 *)(ulong)(uint)(int)cVar4,(char)uVar8);
            std::operator+(&key,"expected \'\"\' in object, got ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &data_1);
            fail(this,(string *)this_01);
            std::__cxx11::string::~string((string *)&key);
            this_04 = (string *)&data_1;
LAB_001074cb:
            std::__cxx11::string::~string((string *)this_04);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
          ::~_Rb_tree(&data._M_t);
          _Var7._M_pi = extraout_RDX_06;
          goto LAB_00106eb7;
        }
        if (cVar4 != 't') {
          esc_abi_cxx11_(&key,(json11 *)(ulong)(uint)(int)cVar4,c_02);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data,
                         "expected value, got ",&key);
          fail(this,(string *)this_01);
          std::__cxx11::string::~string((string *)&data);
          goto LAB_00106e97;
        }
        std::__cxx11::string::string((string *)&data,"true",(allocator *)&key);
        Json::Json(&local_50,true);
        expect(this,(string *)this_01,(Json *)&data);
        this_03 = &local_50.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_03);
    }
    this_02 = (string *)&data;
  }
  else {
    pcVar10 = "exceeded maximum nesting depth";
LAB_00106e76:
    this_02 = (string *)&data;
    std::__cxx11::string::string((string *)this_02,pcVar10,(allocator *)&key);
    fail(this,(string *)this_01);
  }
LAB_00106e97:
  std::__cxx11::string::~string((string *)this_02);
  _Var7._M_pi = extraout_RDX;
LAB_00106eb7:
  JVar12.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  JVar12.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar12.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json parse_json(int depth) {
        if (depth > max_depth) {
            return fail("exceeded maximum nesting depth");
        }

        char ch = get_next_token();
        if (failed)
            return Json();

        if (ch == '-' || (ch >= '0' && ch <= '9')) {
            i--;
            return parse_number();
        }

        if (ch == 't')
            return expect("true", true);

        if (ch == 'f')
            return expect("false", false);

        if (ch == 'n')
            return expect("null", Json());

        if (ch == '"')
            return parse_string();

        if (ch == '{') {
            map<string, Json> data;
            ch = get_next_token();
            if (ch == '}')
                return data;

            while (1) {
                if (ch != '"')
                    return fail("expected '\"' in object, got " + esc(ch));

                string key = parse_string();
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch != ':')
                    return fail("expected ':' in object, got " + esc(ch));

                data[std::move(key)] = parse_json(depth + 1);
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == '}')
                    break;
                if (ch != ',')
                    return fail("expected ',' in object, got " + esc(ch));

                ch = get_next_token();
            }
            return data;
        }

        if (ch == '[') {
            vector<Json> data;
            ch = get_next_token();
            if (ch == ']')
                return data;

            while (1) {
                i--;
                data.push_back(parse_json(depth + 1));
                if (failed)
                    return Json();

                ch = get_next_token();
                if (ch == ']')
                    break;
                if (ch != ',')
                    return fail("expected ',' in list, got " + esc(ch));

                ch = get_next_token();
                (void)ch;
            }
            return data;
        }

        return fail("expected value, got " + esc(ch));
    }